

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

ExecutionState __thiscall
Js::FunctionExecutionStateMachine::GetDefaultInterpreterExecutionState
          (FunctionExecutionStateMachine *this)

{
  bool bVar1;
  ExecutionMode executionMode;
  
  bVar1 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
  if (bVar1) {
    bVar1 = FunctionBody::DoInterpreterAutoProfile((this->owner).ptr);
    executionMode = ProfilingInterpreter - bVar1;
  }
  else {
    executionMode = Interpreter;
  }
  VerifyExecutionMode(this,executionMode);
  return executionMode;
}

Assistant:

FunctionExecutionStateMachine::ExecutionState FunctionExecutionStateMachine::GetDefaultInterpreterExecutionState() const
    {
        if (!owner->DoInterpreterProfile())
        {
            VerifyExecutionMode(ExecutionMode::Interpreter);
            return ExecutionState::Interpreter;
        }
        else if (owner->DoInterpreterAutoProfile())
        {
            VerifyExecutionMode(ExecutionMode::AutoProfilingInterpreter);
            return ExecutionState::AutoProfilingInterpreter0;
        }
        else
        {
            VerifyExecutionMode(ExecutionMode::ProfilingInterpreter);
            return ExecutionState::ProfilingInterpreter0;
        }
    }